

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O2

GLuint __thiscall
deqp::gles3::Functional::anon_unknown_0::SamplerBinder::getBinding(SamplerBinder *this)

{
  ostringstream *this_00;
  GLint arr [32];
  GLuint local_218 [34];
  undefined1 local_190 [384];
  
  local_218[0x1c] = 0;
  local_218[0x1d] = 0;
  local_218[0x1e] = 0;
  local_218[0x1f] = 0;
  local_218[0x18] = 0;
  local_218[0x19] = 0;
  local_218[0x1a] = 0;
  local_218[0x1b] = 0;
  local_218[0x14] = 0;
  local_218[0x15] = 0;
  local_218[0x16] = 0;
  local_218[0x17] = 0;
  local_218[0x10] = 0;
  local_218[0x11] = 0;
  local_218[0x12] = 0;
  local_218[0x13] = 0;
  local_218[0xc] = 0;
  local_218[0xd] = 0;
  local_218[0xe] = 0;
  local_218[0xf] = 0;
  local_218[8] = 0;
  local_218[9] = 0;
  local_218[10] = 0;
  local_218[0xb] = 0;
  local_218[4] = 0;
  local_218[5] = 0;
  local_218[6] = 0;
  local_218[7] = 0;
  local_218[0] = 0;
  local_218[1] = 0;
  local_218[2] = 0;
  local_218[3] = 0;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_Binder).super_ContextWrapper.super_CallLogWrapper,0x8919,
             (GLint *)local_218);
  local_190._0_8_ = ((this->super_Binder).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"// First output integer: ");
  std::ostream::operator<<(this_00,local_218[0]);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  return local_218[0];
}

Assistant:

GLuint				getBinding		(void)
	{
		GLint arr[32] = {};
		glGetIntegerv(GL_SAMPLER_BINDING, arr);
		log() << TestLog::Message << "// First output integer: " << arr[0]
			  << TestLog::EndMessage;
		return arr[0];
	}